

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O2

void __thiscall gimage::Polygon::reduce(Polygon *this,float tolerance)

{
  long *plVar1;
  long lVar2;
  double s;
  pointer pSVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  Vector2d N;
  long local_48;
  
  uVar7 = 1;
  local_48 = 0x18;
  uVar6 = 0;
  do {
    while( true ) {
      uVar8 = uVar7;
      pSVar3 = (this->vertex).
               super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->vertex).
                    super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 4;
      if (uVar4 <= uVar6 + 1) {
        return;
      }
      uVar7 = uVar8 + 1;
      if (uVar4 <= uVar7) break;
      N.v[0] = (double)(pSVar3[uVar7].v[1] - pSVar3[uVar6].v[1]);
      N.v[1] = (double)(pSVar3[uVar6].v[0] - pSVar3[uVar7].v[0]);
      s = gmath::norm<double,2>(&N);
      gmath::SVector<double,_2>::operator/=(&N,s);
      pSVar3 = (this->vertex).
               super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar5 = (long *)((long)pSVar3->v + local_48);
      uVar4 = uVar6;
      while (uVar4 = uVar4 + 1, uVar4 <= uVar8) {
        plVar1 = plVar5 + -1;
        lVar2 = *plVar5;
        plVar5 = plVar5 + 2;
        if ((double)tolerance <
            ABS(((double)*plVar1 * N.v[0] + (double)lVar2 * N.v[1]) -
                ((double)pSVar3[uVar6].v[0] * N.v[0] + (double)pSVar3[uVar6].v[1] * N.v[1])))
        goto LAB_0012230d;
      }
    }
LAB_0012230d:
    std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::erase
              (&this->vertex,pSVar3 + uVar6 + 1,pSVar3 + uVar8);
    uVar7 = uVar6 + 2;
    local_48 = local_48 + 0x10;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void Polygon::reduce(float tolerance)
{
  size_t i=0;
  size_t k=1;

  while (i+1 < vertex.size())
  {
    // test if linear piece can be extended by one

    bool remove=true;
    if (k+1 < vertex.size())
    {
      // get line between vertex i and k+1 in Hesse normal form

      gmath::Vector2d N;
      N[0]=vertex[k+1][1]-vertex[i][1];
      N[1]=vertex[i][0]-vertex[k+1][0];
      N/=norm(N);

      double d=N[0]*vertex[i][0]+N[1]*vertex[i][1];

      // check if distance of vertices in between i and k+1 exceed tolerance

      remove=false;
      for (size_t j=i+1; j<=k; j++)
      {
        if (std::abs(N[0]*vertex[j][0]+N[1]*vertex[j][1]-d) > tolerance)
        {
          remove=true;
          break;
        }
      }
    }

    // remove all vertices between i and k

    if (remove)
    {
      vertex.erase(vertex.begin()+i+1, vertex.begin()+k);

      i++;
      k=i+1;
    }
    else
    {
      k++;
    }
  }
}